

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::TrustTokenBadKeyTest_BadKey_Test::TestBody
          (TrustTokenBadKeyTest_BadKey_Test *this)

{
  uint8_t *request;
  bool bVar1;
  int iVar2;
  TRUST_TOKEN_METHOD *pTVar3;
  pointer ptVar4;
  char *pcVar5;
  pointer ptVar6;
  stack_st_TRUST_TOKEN *__p;
  char *in_R9;
  string local_228;
  AssertHelper local_208;
  Message local_200;
  bool local_1f1;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<struct_stack_st_TRUST_TOKEN> tokens;
  size_t key_index;
  UniquePtr<uint8_t> free_msg;
  AssertHelper local_168;
  Message local_160;
  int local_154;
  undefined1 local_150 [8];
  AssertionResult gtest_ar__2;
  size_t tokens_issued;
  EC_SCALAR *scalars [6];
  trust_token_issuer_key_st *key;
  UniquePtr<uint8_t> free_issue_msg;
  AssertHelper local_d8;
  Message local_d0;
  int local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_90;
  Message local_88;
  int local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_;
  size_t resp_len;
  size_t msg_len;
  uint8_t *issue_resp;
  uint8_t *issue_msg;
  Message local_40;
  uint local_38;
  undefined1 local_28 [8];
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  TrustTokenBadKeyTest_BadKey_Test *this_local;
  
  gtest_fatal_failure_checker.original_reporter_ = (TestPartResultReporterInterface *)this;
  pTVar3 = TrustTokenProtocolTestBase::method((TrustTokenProtocolTestBase *)this);
  if ((pTVar3->has_private_metadata != 0) ||
     ((bVar1 = TrustTokenBadKeyTest::private_metadata(&this->super_TrustTokenBadKeyTest), !bVar1 &&
      (iVar2 = TrustTokenBadKeyTest::corrupted_key(&this->super_TrustTokenBadKeyTest), iVar2 == 4)))
     ) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_28);
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        TrustTokenProtocolTestBase::SetupContexts((TrustTokenProtocolTestBase *)this);
      }
      bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                        ((HasNewFatalFailureHelper *)local_28);
      if (bVar1) {
        local_38 = 2;
      }
      else {
        local_38 = 0;
      }
      testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_28);
      if (local_38 == 0) {
        issue_resp = (uint8_t *)0x0;
        msg_len = 0;
        bVar1 = TrustTokenProtocolTestBase::use_message((TrustTokenProtocolTestBase *)this);
        if (bVar1) {
          ptVar4 = std::unique_ptr<trust_token_client_st,_bssl::internal::Deleter>::get
                             (&(this->super_TrustTokenBadKeyTest).super_TrustTokenProtocolTestBase.
                               client);
          pcVar5 = (char *)0x4;
          local_7c = TRUST_TOKEN_CLIENT_begin_issuance_over_message
                               (ptVar4,&issue_resp,&resp_len,10,"MSG",4);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_78,&local_7c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
          if (!bVar1) {
            testing::Message::Message(&local_88);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__1.message_,(internal *)local_78,
                       (AssertionResult *)
                       "TRUST_TOKEN_CLIENT_begin_issuance_over_message( client.get(), &issue_msg, &msg_len, 10, kMessage, sizeof(kMessage))"
                       ,"false","true",pcVar5);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_90,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                       ,0x4c3,pcVar5);
            testing::internal::AssertHelper::operator=(&local_90,&local_88);
            testing::internal::AssertHelper::~AssertHelper(&local_90);
            std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
            testing::Message::~Message(&local_88);
          }
          local_38 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
        }
        else {
          ptVar4 = std::unique_ptr<trust_token_client_st,_bssl::internal::Deleter>::get
                             (&(this->super_TrustTokenBadKeyTest).super_TrustTokenProtocolTestBase.
                               client);
          local_c4 = TRUST_TOKEN_CLIENT_begin_issuance(ptVar4,&issue_resp,&resp_len,10);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_c0,&local_c4,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
          if (!bVar1) {
            testing::Message::Message(&local_d0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&free_issue_msg,(internal *)local_c0,
                       (AssertionResult *)
                       "TRUST_TOKEN_CLIENT_begin_issuance(client.get(), &issue_msg, &msg_len, 10)",
                       "false","true",in_R9);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_d8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                       ,0x4c6,pcVar5);
            testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
            testing::internal::AssertHelper::~AssertHelper(&local_d8);
            std::__cxx11::string::~string((string *)&free_issue_msg);
            testing::Message::~Message(&local_d0);
          }
          local_38 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
        }
        if (local_38 != 0) {
          return;
        }
        std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&key,issue_resp);
        ptVar6 = std::unique_ptr<trust_token_issuer_st,_bssl::internal::Deleter>::operator->
                           (&(this->super_TrustTokenBadKeyTest).super_TrustTokenProtocolTestBase.
                             issuer);
        scalars[5] = (EC_SCALAR *)ptVar6->keys;
        scalars[0] = &ptVar6->keys[0].key.y0;
        scalars[1] = &ptVar6->keys[0].key.x1;
        scalars[2] = &ptVar6->keys[0].key.y1;
        scalars[3] = &ptVar6->keys[0].key.xs;
        scalars[4] = &ptVar6->keys[0].key.ys;
        iVar2 = TrustTokenBadKeyTest::corrupted_key(&this->super_TrustTokenBadKeyTest);
        scalars[(long)iVar2 + -1]->words[0] = scalars[(long)iVar2 + -1]->words[0] ^ 0x2a;
        ptVar6 = std::unique_ptr<trust_token_issuer_st,_bssl::internal::Deleter>::get
                           (&(this->super_TrustTokenBadKeyTest).super_TrustTokenProtocolTestBase.
                             issuer);
        request = issue_resp;
        bVar1 = TrustTokenBadKeyTest::private_metadata(&this->super_TrustTokenBadKeyTest);
        local_154 = TRUST_TOKEN_ISSUER_issue
                              (ptVar6,(uint8_t **)&msg_len,(size_t *)&gtest_ar_.message_,
                               (size_t *)&gtest_ar__2.message_,request,resp_len,7,bVar1,1);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_150,&local_154,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
        pcVar5 = (char *)resp_len;
        if (!bVar1) {
          testing::Message::Message(&local_160);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&free_msg,(internal *)local_150,
                     (AssertionResult *)
                     "TRUST_TOKEN_ISSUER_issue( issuer.get(), &issue_resp, &resp_len, &tokens_issued, issue_msg, msg_len, 7, private_metadata(), 1)"
                     ,"false","true",(char *)resp_len);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_168,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                     ,0x4d4,pcVar5);
          testing::internal::AssertHelper::operator=(&local_168,&local_160);
          testing::internal::AssertHelper::~AssertHelper(&local_168);
          std::__cxx11::string::~string((string *)&free_msg);
          testing::Message::~Message(&local_160);
          pcVar5 = (char *)resp_len;
        }
        local_38 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
        if (local_38 == 0) {
          std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&key_index,
                     (pointer)msg_len);
          ptVar4 = std::unique_ptr<trust_token_client_st,_bssl::internal::Deleter>::get
                             (&(this->super_TrustTokenBadKeyTest).super_TrustTokenProtocolTestBase.
                               client);
          __p = TRUST_TOKEN_CLIENT_finish_issuance
                          (ptVar4,(size_t *)&tokens,(uint8_t *)msg_len,
                           (size_t)gtest_ar_.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl);
          std::unique_ptr<stack_st_TRUST_TOKEN,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<stack_st_TRUST_TOKEN,bssl::internal::Deleter> *)
                     &gtest_ar__3.message_,__p);
          iVar2 = TrustTokenBadKeyTest::corrupted_key(&this->super_TrustTokenBadKeyTest);
          if (((iVar2 / 2 == 0) &&
              (bVar1 = TrustTokenBadKeyTest::private_metadata(&this->super_TrustTokenBadKeyTest),
              bVar1)) ||
             ((iVar2 = TrustTokenBadKeyTest::corrupted_key(&this->super_TrustTokenBadKeyTest),
              iVar2 / 2 == 1 &&
              (bVar1 = TrustTokenBadKeyTest::private_metadata(&this->super_TrustTokenBadKeyTest),
              !bVar1)))) {
            testing::AssertionResult::
            AssertionResult<std::unique_ptr<stack_st_TRUST_TOKEN,bssl::internal::Deleter>>
                      ((AssertionResult *)local_1b0,
                       (unique_ptr<stack_st_TRUST_TOKEN,_bssl::internal::Deleter> *)
                       &gtest_ar__3.message_,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
            if (!bVar1) {
              testing::Message::Message(&local_1b8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__4.message_,(internal *)local_1b0,
                         (AssertionResult *)"tokens","false","true",pcVar5);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1c0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                         ,0x4de,pcVar5);
              testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
              testing::internal::AssertHelper::~AssertHelper(&local_1c0);
              std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
              testing::Message::~Message(&local_1b8);
            }
            local_38 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
          }
          else {
            bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&gtest_ar__3.message_);
            local_1f1 = !bVar1;
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_1f0,&local_1f1,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
            if (!bVar1) {
              testing::Message::Message(&local_200);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_228,(internal *)local_1f0,(AssertionResult *)"tokens","true","false"
                         ,pcVar5);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_208,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                         ,0x4e0,pcVar5);
              testing::internal::AssertHelper::operator=(&local_208,&local_200);
              testing::internal::AssertHelper::~AssertHelper(&local_208);
              std::__cxx11::string::~string((string *)&local_228);
              testing::Message::~Message(&local_200);
            }
            local_38 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
          }
          if (local_38 == 0) {
            local_38 = 0;
          }
          std::unique_ptr<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<stack_st_TRUST_TOKEN,_bssl::internal::Deleter> *)
                     &gtest_ar__3.message_);
          std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&key_index);
        }
        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&key);
        return;
      }
    }
    testing::Message::Message(&local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&issue_msg,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
               ,0x4bd,
               "Expected: SetupContexts() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&issue_msg,&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&issue_msg);
    testing::Message::~Message(&local_40);
  }
  return;
}

Assistant:

TEST_P(TrustTokenBadKeyTest, BadKey) {
  // For versions without private metadata, only corruptions of 'xs' (the 4th
  // entry in |scalars| below) result in a bad key, as the other scalars are
  // unused internally.
  if (!method()->has_private_metadata &&
      (private_metadata() || corrupted_key() != 4)) {
    return;
  }

  ASSERT_NO_FATAL_FAILURE(SetupContexts());

  uint8_t *issue_msg = NULL, *issue_resp = NULL;
  size_t msg_len, resp_len;
  if (use_message()) {
    ASSERT_TRUE(TRUST_TOKEN_CLIENT_begin_issuance_over_message(
        client.get(), &issue_msg, &msg_len, 10, kMessage, sizeof(kMessage)));
  } else {
    ASSERT_TRUE(TRUST_TOKEN_CLIENT_begin_issuance(client.get(), &issue_msg,
                                                  &msg_len, 10));
  }
  bssl::UniquePtr<uint8_t> free_issue_msg(issue_msg);

  struct trust_token_issuer_key_st *key = &issuer->keys[0];
  EC_SCALAR *scalars[] = {&key->key.x0, &key->key.y0, &key->key.x1,
                          &key->key.y1, &key->key.xs, &key->key.ys};

  // Corrupt private key scalar.
  scalars[corrupted_key()]->words[0] ^= 42;

  size_t tokens_issued;
  ASSERT_TRUE(TRUST_TOKEN_ISSUER_issue(
      issuer.get(), &issue_resp, &resp_len, &tokens_issued, issue_msg, msg_len,
      /*public_metadata=*/7, private_metadata(), /*max_issuance=*/1));
  bssl::UniquePtr<uint8_t> free_msg(issue_resp);
  size_t key_index;
  bssl::UniquePtr<STACK_OF(TRUST_TOKEN)> tokens(
      TRUST_TOKEN_CLIENT_finish_issuance(client.get(), &key_index, issue_resp,
                                         resp_len));

  // If the unused private key is corrupted, then the DLEQ proof should succeed.
  if ((corrupted_key() / 2 == 0 && private_metadata() == true) ||
      (corrupted_key() / 2 == 1 && private_metadata() == false)) {
    ASSERT_TRUE(tokens);
  } else {
    ASSERT_FALSE(tokens);
  }
}